

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

int __thiscall testing::internal::ForkingDeathTest::Wait(ForkingDeathTest *this)

{
  __pid_t _Var1;
  int iVar2;
  int *piVar3;
  int status_value;
  allocator<char> local_121;
  int local_120 [2];
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  iVar2 = 0;
  if ((this->super_DeathTestImpl).spawned_ == true) {
    DeathTestImpl::ReadAndInterpretStatusByte(&this->super_DeathTestImpl);
    while( true ) {
      _Var1 = waitpid(*(__pid_t *)&(this->super_DeathTestImpl).field_0x3c,local_120,0);
      if (_Var1 != -1) break;
      piVar3 = __errno_location();
      if (*piVar3 != 4) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f8,"CHECK failed: File ",&local_121);
        std::operator+(&local_d8,&local_f8,
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/third_party/gtest/googletest/src/gtest-death-test.cc"
                      );
        std::operator+(&local_b8,&local_d8,", line ");
        local_120[1] = 0x44f;
        StreamableToString<int>(&local_118,local_120 + 1);
        std::operator+(&local_98,&local_b8,&local_118);
        std::operator+(&local_78,&local_98,": ");
        std::operator+(&local_58,&local_78,"waitpid(child_pid_, &status_value, 0)");
        std::operator+(&local_38,&local_58," != -1");
        DeathTestAbort(&local_38);
      }
    }
    (this->super_DeathTestImpl).status_ = local_120[0];
    iVar2 = local_120[0];
  }
  return iVar2;
}

Assistant:

int ForkingDeathTest::Wait() {
  if (!spawned())
    return 0;

  ReadAndInterpretStatusByte();

  int status_value;
  GTEST_DEATH_TEST_CHECK_SYSCALL_(waitpid(child_pid_, &status_value, 0));
  set_status(status_value);
  return status_value;
}